

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

_Bool Curl_ssl_getsessionid
                (Curl_cfilter *cf,Curl_easy *data,ssl_peer *peer,void **ssl_sessionid,size_t *idsize
                )

{
  _Bool _Var1;
  int iVar2;
  ssl_primary_config *c1;
  ssl_config_data *psVar3;
  Curl_ssl_session *pCVar4;
  char *pcVar5;
  long *plStack_60;
  _Bool no_match;
  long *general_age;
  size_t i;
  Curl_ssl_session *check;
  ssl_config_data *ssl_config;
  ssl_primary_config *conn_config;
  size_t *idsize_local;
  void **ssl_sessionid_local;
  ssl_peer *peer_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  c1 = Curl_ssl_cf_get_primary_config(cf);
  psVar3 = Curl_ssl_cf_get_config(cf,data);
  cf_local._7_1_ = true;
  *ssl_sessionid = (void *)0x0;
  if (psVar3 == (ssl_config_data *)0x0) {
    cf_local._7_1_ = true;
  }
  else if ((((byte)(psVar3->primary).field_0x79 >> 3 & 1) == 0) ||
          ((data->state).session == (Curl_ssl_session *)0x0)) {
    cf_local._7_1_ = true;
  }
  else {
    if ((data->share == (Curl_share *)0x0) || ((data->share->specifier & 0x10) == 0)) {
      plStack_60 = &(data->state).sessionage;
    }
    else {
      plStack_60 = &data->share->sessionage;
    }
    for (general_age = (long *)0x0; general_age < (long *)(data->set).general_ssl.max_ssl_sessions;
        general_age = (long *)((long)general_age + 1)) {
      pCVar4 = (data->state).session + (long)general_age;
      if (((((pCVar4->sessionid != (void *)0x0) &&
            (iVar2 = curl_strequal(peer->hostname,pCVar4->name), iVar2 != 0)) &&
           (((((ulong)cf->conn->bits >> 8 & 1) == 0 && (pCVar4->conn_to_host == (char *)0x0)) ||
            (((((ulong)cf->conn->bits >> 8 & 1) != 0 && (pCVar4->conn_to_host != (char *)0x0)) &&
             (iVar2 = curl_strequal((cf->conn->conn_to_host).name,pCVar4->conn_to_host), iVar2 != 0)
             ))))) &&
          (((((ulong)cf->conn->bits >> 9 & 1) == 0 && (pCVar4->conn_to_port == -1)) ||
           ((((ulong)cf->conn->bits >> 9 & 1) != 0 &&
            ((pCVar4->conn_to_port != -1 && (cf->conn->conn_to_port == pCVar4->conn_to_port))))))))
         && ((peer->port == pCVar4->remote_port &&
             (((peer->transport == pCVar4->transport &&
               (iVar2 = curl_strequal(cf->conn->handler->scheme,pCVar4->scheme), iVar2 != 0)) &&
              (_Var1 = match_ssl_primary_config(data,c1,&pCVar4->ssl_config), _Var1)))))) {
        *plStack_60 = *plStack_60 + 1;
        pCVar4->age = *plStack_60;
        *ssl_sessionid = pCVar4->sessionid;
        if (idsize != (size_t *)0x0) {
          *idsize = pCVar4->idsize;
        }
        cf_local._7_1_ = false;
        break;
      }
    }
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      pcVar5 = "Found";
      if (cf_local._7_1_ != false) {
        pcVar5 = "No";
      }
      Curl_trc_cf_infof(data,cf,"%s cached session ID for %s://%s:%d",pcVar5,
                        cf->conn->handler->scheme,peer->hostname,peer->port);
    }
  }
  return cf_local._7_1_;
}

Assistant:

bool Curl_ssl_getsessionid(struct Curl_cfilter *cf,
                           struct Curl_easy *data,
                           const struct ssl_peer *peer,
                           void **ssl_sessionid,
                           size_t *idsize) /* set 0 if unknown */
{
  struct ssl_primary_config *conn_config = Curl_ssl_cf_get_primary_config(cf);
  struct ssl_config_data *ssl_config = Curl_ssl_cf_get_config(cf, data);
  struct Curl_ssl_session *check;
  size_t i;
  long *general_age;
  bool no_match = TRUE;

  *ssl_sessionid = NULL;
  if(!ssl_config)
    return TRUE;

  DEBUGASSERT(ssl_config->primary.cache_session);

  if(!ssl_config->primary.cache_session || !data->state.session)
    /* session ID reuse is disabled or the session cache has not been
       setup */
    return TRUE;

  /* Lock if shared */
  if(SSLSESSION_SHARED(data))
    general_age = &data->share->sessionage;
  else
    general_age = &data->state.sessionage;

  for(i = 0; i < data->set.general_ssl.max_ssl_sessions; i++) {
    check = &data->state.session[i];
    if(!check->sessionid)
      /* not session ID means blank entry */
      continue;
    if(strcasecompare(peer->hostname, check->name) &&
       ((!cf->conn->bits.conn_to_host && !check->conn_to_host) ||
        (cf->conn->bits.conn_to_host && check->conn_to_host &&
         strcasecompare(cf->conn->conn_to_host.name, check->conn_to_host))) &&
       ((!cf->conn->bits.conn_to_port && check->conn_to_port == -1) ||
        (cf->conn->bits.conn_to_port && check->conn_to_port != -1 &&
         cf->conn->conn_to_port == check->conn_to_port)) &&
       (peer->port == check->remote_port) &&
       (peer->transport == check->transport) &&
       strcasecompare(cf->conn->handler->scheme, check->scheme) &&
       match_ssl_primary_config(data, conn_config, &check->ssl_config)) {
      /* yes, we have a session ID! */
      (*general_age)++;          /* increase general age */
      check->age = *general_age; /* set this as used in this age */
      *ssl_sessionid = check->sessionid;
      if(idsize)
        *idsize = check->idsize;
      no_match = FALSE;
      break;
    }
  }

  CURL_TRC_CF(data, cf, "%s cached session ID for %s://%s:%d",
              no_match? "No": "Found",
              cf->conn->handler->scheme, peer->hostname, peer->port);
  return no_match;
}